

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

DUAL_FILTER_TYPE
find_best_interp_rd_facade
          (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,BUFFER_SET *orig_dst,
          int64_t *rd,RD_STATS *rd_stats_y,RD_STATS *rd_stats,int *switchable_rate,
          BUFFER_SET **dst_bufs,int *switchable_ctx,int skip_pred,uint16_t allow_interp_mask,
          int is_w4_or_h4)

{
  uint8_t uVar1;
  int64_t iVar2;
  int64_t *in_stack_00000010;
  BUFFER_SET *in_stack_00000018;
  BLOCK_SIZE in_stack_00000027;
  TileDataEnc *in_stack_00000028;
  undefined4 in_stack_00000030;
  undefined4 in_stack_00000034;
  uint16_t in_stack_00000038;
  undefined6 in_stack_0000003a;
  int is_filter_allowed;
  int filt_type;
  DUAL_FILTER_TYPE best_filt_type;
  int tmp_skip_pred;
  undefined7 in_stack_00000060;
  int in_stack_00000080;
  int local_64;
  DUAL_FILTER_TYPE local_5d;
  DUAL_FILTER_TYPE local_21;
  
  local_5d = '\0';
  if (in_stack_00000038 == 0) {
    local_21 = '\0';
  }
  else {
    for (local_64 = 8; -1 < local_64; local_64 = local_64 + -1) {
      uVar1 = get_interp_filter_allowed_mask(in_stack_00000038,(DUAL_FILTER_TYPE)local_64);
      if ((uVar1 != '\0') &&
         (iVar2 = interpolation_filter_rd
                            ((MACROBLOCK *)CONCAT62(in_stack_0000003a,in_stack_00000038),
                             (AV1_COMP *)CONCAT44(in_stack_00000034,in_stack_00000030),
                             in_stack_00000028,in_stack_00000027,in_stack_00000018,in_stack_00000010
                             ,(RD_STATS *)rd,(RD_STATS *)orig_dst,
                             (int *)CONCAT17(bsize,in_stack_00000060),(BUFFER_SET **)tile_data,
                             (int)cpi,(int *)x,in_stack_00000080), iVar2 != 0)) {
        local_5d = (DUAL_FILTER_TYPE)local_64;
      }
    }
    local_21 = local_5d;
  }
  return local_21;
}

Assistant:

static DUAL_FILTER_TYPE find_best_interp_rd_facade(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], const int switchable_ctx[2],
    const int skip_pred, uint16_t allow_interp_mask, int is_w4_or_h4) {
  int tmp_skip_pred = skip_pred;
  DUAL_FILTER_TYPE best_filt_type = REG_REG;

  // If no filter are set to be evaluated, return from function
  if (allow_interp_mask == 0x0) return best_filt_type;
  // For block width or height is 4, skip the pred evaluation of SHARP_SHARP
  tmp_skip_pred = is_w4_or_h4
                      ? cpi->interp_search_flags.default_interp_skip_flags
                      : skip_pred;

  // Loop over the all filter types and evaluate for only allowed filter types
  for (int filt_type = SHARP_SHARP; filt_type >= REG_REG; --filt_type) {
    const int is_filter_allowed =
        get_interp_filter_allowed_mask(allow_interp_mask, filt_type);
    if (is_filter_allowed)
      if (interpolation_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                  rd_stats_y, rd_stats, switchable_rate,
                                  dst_bufs, filt_type, switchable_ctx,
                                  tmp_skip_pred))
        best_filt_type = filt_type;
    tmp_skip_pred = skip_pred;
  }
  return best_filt_type;
}